

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

bool Cmd::iequals(string_view a,string_view b)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  sVar4 = a._M_len;
  if (sVar4 != b._M_len) {
    return false;
  }
  if (sVar4 == 0) {
    bVar6 = true;
  }
  else {
    lVar5 = 0;
    do {
      bVar1 = b._M_str[lVar5];
      iVar2 = tolower((uint)(byte)a._M_str[lVar5]);
      iVar3 = tolower((uint)bVar1);
      bVar6 = iVar2 == iVar3;
      if (!bVar6) {
        return bVar6;
      }
      bVar7 = sVar4 - 1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar7);
  }
  return bVar6;
}

Assistant:

static bool iequals(std::string_view a, std::string_view b) {
		if (a.size() != b.size()) {
			return false;
		}

		return std::equal(a.begin(), a.end(), b.begin(), b.end(), [](unsigned char a, unsigned char b) {
			return tolower(a) == tolower(b);
		});
	}